

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

bool __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_boolean
          (xpath_ast_node *this,xpath_context *c,xpath_stack *stack)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  char cVar4;
  char cVar5;
  byte bVar6;
  undefined8 uVar7;
  bool bVar8;
  undefined1 uVar9;
  bool bVar10;
  int *piVar11;
  xml_attribute xVar12;
  long lVar13;
  char *pcVar14;
  xml_node_struct *pxVar15;
  xpath_memory_block *pxVar16;
  xpath_ast_node *pxVar17;
  xpath_ast_node *this_00;
  xpath_ast_node *pxVar18;
  byte bVar19;
  char_t *pcVar20;
  byte bVar21;
  less_equal *in_R8;
  int *dst;
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 local_f4;
  double v;
  xpath_memory_block *local_e8;
  size_t sStack_e0;
  bool *local_d8;
  xpath_node_set_raw local_d0;
  double local_b0;
  xpath_node_set_raw local_a8;
  double local_88;
  xpath_allocator_capture local_80;
  xpath_string local_60;
  xpath_string local_48;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  local_f4 = xpath_type_none;
LAB_0010ab01:
  cVar4 = this->_type;
  lVar13 = 0x10;
  switch(cVar4) {
  case '\x01':
    bVar8 = eval_boolean(this->_left,c,stack);
    if (bVar8) {
switchD_0010ab4c_caseD_2f:
      uVar9 = xpath_type_node_set;
      goto LAB_0010b10a;
    }
    break;
  case '\x02':
    bVar8 = eval_boolean(this->_left,c,stack);
    if (!bVar8) goto switchD_0010ab4c_caseD_30;
    break;
  case '\x03':
    goto switchD_0010ab15_caseD_3;
  case '\x04':
    pxVar17 = this->_left;
    this = this->_right;
    cVar4 = pxVar17->_rettype;
    cVar5 = this->_rettype;
    if ((cVar4 == '\x01') || (cVar5 == '\x01')) {
      if (cVar5 == '\x01' && cVar4 == '\x01') {
        v = (double)stack->result;
        local_e8 = ((xpath_allocator *)v)->_root;
        sStack_e0 = ((xpath_allocator *)v)->_root_size;
        local_d8 = ((xpath_allocator *)v)->_error;
        eval_node_set(&local_d0,pxVar17,c,stack,nodeset_eval_all);
        eval_node_set(&local_a8,this,c,stack,nodeset_eval_all);
        for (; uVar9 = local_d0._begin != local_d0._end,
            pxVar16 = (xpath_memory_block *)local_a8._begin, (bool)uVar9;
            local_d0._begin = local_d0._begin + 1) {
          while (pxVar16 != (xpath_memory_block *)local_a8._end) {
            local_80._target = stack->result;
            local_80._state._error = (local_80._target)->_error;
            local_80._state._root = (local_80._target)->_root;
            local_80._state._root_size = (local_80._target)->_root_size;
            string_value(&local_60,local_d0._begin,local_80._target);
            string_value(&local_48,(xpath_node *)pxVar16,stack->result);
            bVar8 = strequal(local_60._buffer,local_48._buffer);
            xpath_allocator_capture::~xpath_allocator_capture(&local_80);
            pxVar16 = (xpath_memory_block *)&pxVar16->field_2;
            if (!bVar8) goto LAB_0010aea9;
          }
        }
        goto LAB_0010aea9;
      }
      pxVar18 = pxVar17;
      if (cVar4 == '\x01') {
        pxVar18 = this;
        this = pxVar17;
        cVar4 = cVar5;
      }
      if (cVar4 == '\x02') {
        v = (double)stack->result;
        local_e8 = ((xpath_allocator *)v)->_root;
        sStack_e0 = ((xpath_allocator *)v)->_root_size;
        local_d8 = ((xpath_allocator *)v)->_error;
        local_88 = eval_number(pxVar18,c,stack);
        eval_node_set(&local_d0,this,c,stack,nodeset_eval_all);
        goto LAB_0010b6a0;
      }
      if (cVar4 == '\x03') {
        v = (double)stack->result;
        local_e8 = ((xpath_allocator *)v)->_root;
        sStack_e0 = ((xpath_allocator *)v)->_root_size;
        local_d8 = ((xpath_allocator *)v)->_error;
        eval_string((xpath_string *)&local_80,pxVar18,c,stack);
        eval_node_set(&local_d0,this,c,stack,nodeset_eval_all);
        goto LAB_0010b5e2;
      }
      if (cVar4 != '\x04') goto LAB_0010b764;
      bVar8 = eval_boolean(pxVar18,c,stack);
      bVar10 = eval_boolean(this,c,stack);
      local_f4 = local_f4 ^ bVar10 != bVar8;
      goto LAB_0010b111;
    }
    if (cVar4 == '\x04' || cVar5 == '\x04') goto code_r0x0010aba7;
    if (cVar4 == '\x02' || cVar5 == '\x02') {
      local_b0 = eval_number(pxVar17,c,stack);
      auVar24._0_8_ = eval_number(this,c,stack);
      auVar24._8_56_ = extraout_var_00;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_b0;
      uVar7 = vcmpsd_avx512f(auVar24._0_16_,auVar3,4);
      uVar9 = (char)uVar7 & xpath_type_node_set;
      goto LAB_0010b10a;
    }
    if (cVar4 == '\x03' || cVar5 == '\x03') {
      v = (double)stack->result;
      local_e8 = ((xpath_allocator *)v)->_root;
      sStack_e0 = ((xpath_allocator *)v)->_root_size;
      local_d8 = ((xpath_allocator *)v)->_error;
      eval_string((xpath_string *)&local_d0,pxVar17,c,stack);
      eval_string((xpath_string *)&local_a8,this,c,stack);
      bVar8 = strequal((char_t *)local_d0._0_8_,(char_t *)local_a8._0_8_);
      uVar9 = !bVar8;
      goto LAB_0010aea9;
    }
LAB_0010b764:
    pcVar14 = 
    "static bool pugi::impl::(anonymous namespace)::xpath_ast_node::compare_eq(xpath_ast_node *, xpath_ast_node *, const xpath_context &, const xpath_stack &, const Comp &) [Comp = pugi::impl::(anonymous namespace)::not_equal_to]"
    ;
    goto LAB_0010b75a;
  case '\x05':
    pxVar18 = this->_left;
    pxVar17 = this->_right;
    goto LAB_0010ad00;
  case '\x06':
    pxVar17 = this->_left;
    pxVar18 = this->_right;
LAB_0010ad00:
    uVar9 = compare_rel<pugi::impl::(anonymous_namespace)::less>
                      (pxVar18,pxVar17,c,stack,(less *)in_R8);
    goto LAB_0010b10a;
  case '\a':
    pxVar18 = this->_left;
    pxVar17 = this->_right;
    goto LAB_0010aceb;
  case '\b':
    pxVar17 = this->_left;
    pxVar18 = this->_right;
LAB_0010aceb:
    uVar9 = compare_rel<pugi::impl::(anonymous_namespace)::less_equal>
                      (pxVar18,pxVar17,c,stack,in_R8);
    goto LAB_0010b10a;
  case '\t':
  case '\n':
  case '\v':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
switchD_0010ab15_caseD_9:
    bVar6 = this->_rettype;
    goto LAB_0010ac8e;
  case '\x14':
    bVar6 = this->_rettype;
    if (((this->_data).variable)->_type != (uint)bVar6) {
      __assert_fail("_rettype == _data.variable->type()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x2898,
                    "bool pugi::impl::(anonymous namespace)::xpath_ast_node::eval_boolean(const xpath_context &, const xpath_stack &)"
                   );
    }
    if (bVar6 == 4) {
      uVar9 = (undefined1)(this->_data).variable[1]._type;
      goto LAB_0010b10a;
    }
LAB_0010ac8e:
    if (bVar6 == 1) {
      v = (double)stack->result;
      local_e8 = ((xpath_allocator *)v)->_root;
      sStack_e0 = ((xpath_allocator *)v)->_root_size;
      local_d8 = ((xpath_allocator *)v)->_error;
      eval_node_set(&local_d0,this,c,stack,nodeset_eval_any);
      bVar8 = local_d0._begin == local_d0._end;
    }
    else {
      if (bVar6 != 3) {
        if (bVar6 != 2) {
          __assert_fail("false && \"Wrong expression for return type boolean\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                        ,0x28b5,
                        "bool pugi::impl::(anonymous namespace)::xpath_ast_node::eval_boolean(const xpath_context &, const xpath_stack &)"
                       );
        }
        auVar22._0_8_ = eval_number(this,c,stack);
        if ((auVar22._0_8_ != 0.0) || (NAN(auVar22._0_8_))) {
          auVar22._8_8_ = 0;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = auVar22._0_8_;
          uVar7 = vcmpsd_avx512f(auVar22,auVar1,0);
          uVar9 = (char)uVar7 & xpath_type_node_set;
          goto LAB_0010b10a;
        }
        goto switchD_0010ab4c_caseD_30;
      }
      v = (double)stack->result;
      local_e8 = ((xpath_allocator *)v)->_root;
      sStack_e0 = ((xpath_allocator *)v)->_root_size;
      local_d8 = ((xpath_allocator *)v)->_error;
      eval_string((xpath_string *)&local_d0,this,c,stack);
      bVar8 = *(char_t *)local_d0._0_8_ == '\0';
    }
LAB_0010aea5:
    uVar9 = !bVar8;
    goto LAB_0010aea9;
  default:
    lVar13 = 8;
    switch(cVar4) {
    case '\"':
      v = (double)stack->result;
      local_e8 = ((xpath_allocator *)v)->_root;
      sStack_e0 = ((xpath_allocator *)v)->_root_size;
      local_d8 = ((xpath_allocator *)v)->_error;
      eval_string((xpath_string *)&local_d0,this->_left,c,stack);
      eval_string((xpath_string *)&local_a8,this->_right,c,stack);
      uVar9 = starts_with((char_t *)local_d0._0_8_,(char_t *)local_a8._0_8_);
      goto LAB_0010aea9;
    case '#':
      v = (double)stack->result;
      local_e8 = ((xpath_allocator *)v)->_root;
      sStack_e0 = ((xpath_allocator *)v)->_root_size;
      local_d8 = ((xpath_allocator *)v)->_error;
      eval_string((xpath_string *)&local_d0,this->_left,c,stack);
      eval_string((xpath_string *)&local_a8,this->_right,c,stack);
      pcVar14 = strstr((char *)local_d0._0_8_,(char *)local_a8._0_8_);
      bVar8 = pcVar14 == (char *)0x0;
      goto LAB_0010aea5;
    case '$':
    case '%':
    case '&':
    case '\'':
    case '(':
    case ')':
    case '*':
    case '+':
    case ',':
      goto switchD_0010ab15_caseD_9;
    case '-':
      goto switchD_0010ab4c_caseD_2d;
    case '.':
      bVar8 = eval_boolean(this->_left,c,stack);
      goto LAB_0010b052;
    case '/':
      goto switchD_0010ab4c_caseD_2f;
    case '0':
      break;
    case '1':
      if ((c->n)._attribute._attr == (xml_attribute_struct *)0x0) {
        v = (double)stack->result;
        local_e8 = ((xpath_allocator *)v)->_root;
        sStack_e0 = ((xpath_allocator *)v)->_root_size;
        local_d8 = ((xpath_allocator *)v)->_error;
        eval_string((xpath_string *)&local_d0,this->_left,c,stack);
        if ((c->n)._attribute._attr == (xml_attribute_struct *)0x0) {
          pxVar15 = (c->n)._node._root;
        }
        else {
          pxVar15 = (xml_node_struct *)0x0;
        }
        goto LAB_0010b06b;
      }
      break;
    default:
      if (cVar4 != ';') goto switchD_0010ab15_caseD_9;
      dst = (int *)(this->_right->_data).string;
      if (this->_right->_type != '\x12') {
        if (*dst == 3) {
          piVar11 = *(int **)(dst + 4);
        }
        else {
          piVar11 = (int *)0x0;
        }
        dst = (int *)0x11602d;
        if (piVar11 != (int *)0x0) {
          dst = piVar11;
        }
      }
      uVar9 = xpath_type_none;
      if ((c->n)._attribute._attr == (xml_attribute_struct *)0x0) {
        v = (double)(c->n)._node._root;
      }
      else {
        v = 0.0;
      }
      xVar12 = xml_node::attribute((xml_node *)&v,(this->_left->_data).string);
      if (xVar12._attr == (xml_attribute_struct *)0x0) goto LAB_0010b10a;
      pcVar20 = (xVar12._attr)->value;
      if (pcVar20 == (char_t *)0x0) {
        pcVar20 = "";
      }
      bVar8 = strequal(pcVar20,(char_t *)dst);
      if (bVar8) {
        pcVar20 = "";
        if ((xVar12._attr)->name != (char_t *)0x0) {
          pcVar20 = (xVar12._attr)->name;
        }
        uVar9 = is_xpath_attribute(pcVar20);
        goto LAB_0010b10a;
      }
    }
switchD_0010ab4c_caseD_30:
    uVar9 = xpath_type_none;
    goto LAB_0010b10a;
  }
switchD_0010ab4c_caseD_2d:
  this = *(xpath_ast_node **)(&this->_type + lVar13);
  goto LAB_0010ab01;
LAB_0010b06b:
  local_a8._0_8_ = pxVar15;
  if (pxVar15 == (xml_node_struct *)0x0) goto LAB_0010b183;
  xVar12 = xml_node::attribute((xml_node *)&local_a8,(char_t *)"xml:lang");
  if (xVar12._attr != (xml_attribute_struct *)0x0) {
    pcVar20 = "";
    if ((xVar12._attr)->value != (char_t *)0x0) {
      pcVar20 = (xVar12._attr)->value;
    }
    lVar13 = 0;
    goto LAB_0010b13e;
  }
  pxVar15 = pxVar15->parent;
  goto LAB_0010b06b;
LAB_0010b13e:
  bVar6 = *(byte *)(local_d0._0_8_ + lVar13);
  if (bVar6 == 0) goto LAB_0010b1f3;
  bVar19 = bVar6 | 0x20;
  if (0x19 < bVar6 - 0x41) {
    bVar19 = bVar6;
  }
  bVar6 = pcVar20[lVar13];
  bVar21 = bVar6 | 0x20;
  if (0x19 < bVar6 - 0x41) {
    bVar21 = bVar6;
  }
  if (bVar19 != bVar21) goto LAB_0010b183;
  lVar13 = lVar13 + 1;
  goto LAB_0010b13e;
LAB_0010b1f3:
  uVar9 = pcVar20[lVar13] == '-' || pcVar20[lVar13] == '\0';
  goto LAB_0010aea9;
LAB_0010b183:
  uVar9 = false;
  goto LAB_0010aea9;
LAB_0010b6a0:
  uVar9 = local_d0._begin != local_d0._end;
  if (local_d0._begin == local_d0._end) goto LAB_0010aea9;
  local_a8._0_8_ = stack->result;
  local_a8._eos = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->value;
  local_a8._begin = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->header;
  local_a8._end = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->name;
  string_value((xpath_string *)&local_80,local_d0._begin,(xpath_allocator *)local_a8._0_8_);
  local_b0 = convert_string_to_number((char_t *)local_80._target);
  xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&local_a8);
  local_d0._begin = local_d0._begin + 1;
  if ((local_88 != local_b0) || (NAN(local_88) || NAN(local_b0))) goto LAB_0010aea9;
  goto LAB_0010b6a0;
code_r0x0010aba7:
  bVar8 = eval_boolean(pxVar17,c,stack);
  local_f4 = local_f4 ^ bVar8;
  goto LAB_0010ab01;
switchD_0010ab15_caseD_3:
  pxVar17 = this->_left;
  pxVar18 = this->_right;
  cVar4 = pxVar17->_rettype;
  cVar5 = pxVar18->_rettype;
  if (cVar5 == '\x01' || cVar4 == '\x01') {
    if (cVar5 == '\x01' && cVar4 == '\x01') {
      v = (double)stack->result;
      local_e8 = ((xpath_allocator *)v)->_root;
      sStack_e0 = ((xpath_allocator *)v)->_root_size;
      local_d8 = ((xpath_allocator *)v)->_error;
      eval_node_set(&local_d0,pxVar17,c,stack,nodeset_eval_all);
      eval_node_set(&local_a8,pxVar18,c,stack,nodeset_eval_all);
      for (; uVar9 = local_d0._begin != local_d0._end,
          pxVar16 = (xpath_memory_block *)local_a8._begin, (bool)uVar9;
          local_d0._begin = local_d0._begin + 1) {
        while (pxVar16 != (xpath_memory_block *)local_a8._end) {
          local_80._target = stack->result;
          local_80._state._error = (local_80._target)->_error;
          local_80._state._root = (local_80._target)->_root;
          local_80._state._root_size = (local_80._target)->_root_size;
          string_value(&local_60,local_d0._begin,local_80._target);
          string_value(&local_48,(xpath_node *)pxVar16,stack->result);
          bVar8 = strequal(local_60._buffer,local_48._buffer);
          xpath_allocator_capture::~xpath_allocator_capture(&local_80);
          pxVar16 = (xpath_memory_block *)&pxVar16->field_2;
          if (bVar8) goto LAB_0010aea9;
        }
      }
    }
    else {
      this_00 = pxVar17;
      if (cVar4 == '\x01') {
        this_00 = pxVar18;
        pxVar18 = pxVar17;
        cVar4 = cVar5;
      }
      if (cVar4 == '\x02') {
        v = (double)stack->result;
        local_e8 = ((xpath_allocator *)v)->_root;
        sStack_e0 = ((xpath_allocator *)v)->_root_size;
        local_d8 = ((xpath_allocator *)v)->_error;
        local_88 = eval_number(this_00,c,stack);
        eval_node_set(&local_d0,pxVar18,c,stack,nodeset_eval_all);
        do {
          uVar9 = local_d0._begin != local_d0._end;
          if (local_d0._begin == local_d0._end) break;
          local_a8._0_8_ = stack->result;
          local_a8._eos = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->value;
          local_a8._begin = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->header;
          local_a8._end = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->name;
          string_value((xpath_string *)&local_80,local_d0._begin,(xpath_allocator *)local_a8._0_8_);
          local_b0 = convert_string_to_number((char_t *)local_80._target);
          xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&local_a8);
          local_d0._begin = local_d0._begin + 1;
        } while ((local_88 != local_b0) || (NAN(local_88) || NAN(local_b0)));
      }
      else {
        if (cVar4 != '\x03') {
          if (cVar4 != '\x04') goto LAB_0010b745;
          bVar10 = eval_boolean(this_00,c,stack);
          goto LAB_0010b044;
        }
        v = (double)stack->result;
        local_e8 = ((xpath_allocator *)v)->_root;
        sStack_e0 = ((xpath_allocator *)v)->_root_size;
        local_d8 = ((xpath_allocator *)v)->_error;
        eval_string((xpath_string *)&local_80,this_00,c,stack);
        eval_node_set(&local_d0,pxVar18,c,stack,nodeset_eval_all);
        do {
          uVar9 = local_d0._begin != local_d0._end;
          if (local_d0._begin == local_d0._end) break;
          local_a8._0_8_ = stack->result;
          local_a8._eos = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->value;
          local_a8._begin = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->header;
          local_a8._end = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->name;
          string_value(&local_60,local_d0._begin,(xpath_allocator *)local_a8._0_8_);
          bVar8 = strequal((char_t *)local_80._target,local_60._buffer);
          xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&local_a8);
          local_d0._begin = local_d0._begin + 1;
        } while (!bVar8);
      }
    }
    goto LAB_0010aea9;
  }
  if (cVar5 == '\x04' || cVar4 == '\x04') {
    bVar10 = eval_boolean(pxVar17,c,stack);
LAB_0010b044:
    bVar8 = eval_boolean(pxVar18,c,stack);
    bVar8 = (bool)(bVar8 ^ bVar10);
LAB_0010b052:
    local_f4 = bVar8 ^ local_f4 ^ xpath_type_node_set;
    goto LAB_0010b111;
  }
  if (cVar4 != '\x02' && cVar5 != '\x02') {
    if (cVar4 != '\x03' && cVar5 != '\x03') {
LAB_0010b745:
      pcVar14 = 
      "static bool pugi::impl::(anonymous namespace)::xpath_ast_node::compare_eq(xpath_ast_node *, xpath_ast_node *, const xpath_context &, const xpath_stack &, const Comp &) [Comp = pugi::impl::(anonymous namespace)::equal_to]"
      ;
LAB_0010b75a:
      __assert_fail("false && \"Wrong types\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x258a,pcVar14);
    }
    v = (double)stack->result;
    local_e8 = ((xpath_allocator *)v)->_root;
    sStack_e0 = ((xpath_allocator *)v)->_root_size;
    local_d8 = ((xpath_allocator *)v)->_error;
    eval_string((xpath_string *)&local_d0,pxVar17,c,stack);
    eval_string((xpath_string *)&local_a8,pxVar18,c,stack);
    uVar9 = strequal((char_t *)local_d0._0_8_,(char_t *)local_a8._0_8_);
    goto LAB_0010aea9;
  }
  local_b0 = eval_number(pxVar17,c,stack);
  auVar23._0_8_ = eval_number(pxVar18,c,stack);
  auVar23._8_56_ = extraout_var;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_b0;
  uVar7 = vcmpsd_avx512f(auVar23._0_16_,auVar2,0);
  uVar9 = (char)uVar7 & xpath_type_node_set;
  goto LAB_0010b10a;
  while( true ) {
    local_a8._0_8_ = stack->result;
    local_a8._eos = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->value;
    local_a8._begin = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->header;
    local_a8._end = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->name;
    string_value(&local_60,local_d0._begin,(xpath_allocator *)local_a8._0_8_);
    bVar8 = strequal((char_t *)local_80._target,local_60._buffer);
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&local_a8);
    local_d0._begin = local_d0._begin + 1;
    if (!bVar8) break;
LAB_0010b5e2:
    uVar9 = local_d0._begin != local_d0._end;
    if (local_d0._begin == local_d0._end) break;
  }
LAB_0010aea9:
  xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&v);
LAB_0010b10a:
  local_f4 = local_f4 ^ uVar9;
LAB_0010b111:
  return (bool)(local_f4 & xpath_type_node_set);
}

Assistant:

bool eval_boolean(const xpath_context& c, const xpath_stack& stack)
		{
			switch (_type)
			{
			case ast_op_or:
				return _left->eval_boolean(c, stack) || _right->eval_boolean(c, stack);

			case ast_op_and:
				return _left->eval_boolean(c, stack) && _right->eval_boolean(c, stack);

			case ast_op_equal:
				return compare_eq(_left, _right, c, stack, equal_to());

			case ast_op_not_equal:
				return compare_eq(_left, _right, c, stack, not_equal_to());

			case ast_op_less:
				return compare_rel(_left, _right, c, stack, less());

			case ast_op_greater:
				return compare_rel(_right, _left, c, stack, less());

			case ast_op_less_or_equal:
				return compare_rel(_left, _right, c, stack, less_equal());

			case ast_op_greater_or_equal:
				return compare_rel(_right, _left, c, stack, less_equal());

			case ast_func_starts_with:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_string lr = _left->eval_string(c, stack);
				xpath_string rr = _right->eval_string(c, stack);

				return starts_with(lr.c_str(), rr.c_str());
			}

			case ast_func_contains:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_string lr = _left->eval_string(c, stack);
				xpath_string rr = _right->eval_string(c, stack);

				return find_substring(lr.c_str(), rr.c_str()) != 0;
			}

			case ast_func_boolean:
				return _left->eval_boolean(c, stack);

			case ast_func_not:
				return !_left->eval_boolean(c, stack);

			case ast_func_true:
				return true;

			case ast_func_false:
				return false;

			case ast_func_lang:
			{
				if (c.n.attribute()) return false;

				xpath_allocator_capture cr(stack.result);

				xpath_string lang = _left->eval_string(c, stack);

				for (xml_node n = c.n.node(); n; n = n.parent())
				{
					xml_attribute a = n.attribute(PUGIXML_TEXT("xml:lang"));

					if (a)
					{
						const char_t* value = a.value();

						// strnicmp / strncasecmp is not portable
						for (const char_t* lit = lang.c_str(); *lit; ++lit)
						{
							if (tolower_ascii(*lit) != tolower_ascii(*value)) return false;
							++value;
						}

						return *value == 0 || *value == '-';
					}
				}

				return false;
			}

			case ast_opt_compare_attribute:
			{
				const char_t* value = (_right->_type == ast_string_constant) ? _right->_data.string : _right->_data.variable->get_string();

				xml_attribute attr = c.n.node().attribute(_left->_data.nodetest);

				return attr && strequal(attr.value(), value) && is_xpath_attribute(attr.name());
			}

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_boolean)
					return _data.variable->get_boolean();
			}

			// fallthrough
			default:
			{
				switch (_rettype)
				{
				case xpath_type_number:
					return convert_number_to_boolean(eval_number(c, stack));

				case xpath_type_string:
				{
					xpath_allocator_capture cr(stack.result);

					return !eval_string(c, stack).empty();
				}

				case xpath_type_node_set:
				{
					xpath_allocator_capture cr(stack.result);

					return !eval_node_set(c, stack, nodeset_eval_any).empty();
				}

				default:
					assert(false && "Wrong expression for return type boolean"); // unreachable
					return false;
				}
			}
			}
		}